

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O2

NLW2_SOLReadResultCode mp::Read(FILE *f,int binary,double *v,string *err)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  
  std::__cxx11::string::resize((ulong)err);
  if (binary == 0) {
    pcVar3 = fgets((err->_M_dataplus)._M_p,(int)err->_M_string_length + -1,(FILE *)f);
    if (pcVar3 != (char *)0x0) {
      iVar1 = decstring((err->_M_dataplus)._M_p,v);
      if (iVar1 == 0) {
        return NLW2_SOLRead_OK;
      }
      return NLW2_SOLRead_Bad_Line;
    }
  }
  else {
    sVar2 = fread(v,8,1,(FILE *)f);
    if (sVar2 != 0) {
      return NLW2_SOLRead_OK;
    }
  }
  return NLW2_SOLRead_Early_EOF;
}

Assistant:

inline NLW2_SOLReadResultCode Read(
    FILE* f, int binary, double& v, std::string& err) {
  err.resize(512);
  if (binary ? !std::fread((char *)&v, sizeof(double), 1, f)
       : !fgets((char*)err.data(), err.size()-1, f))
    return NLW2_SOLRead_Early_EOF;
  if (!binary && decstring(err.data(), &v))
    return NLW2_SOLRead_Bad_Line;
  return NLW2_SOLRead_OK;
}